

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-node.h
# Opt level: O0

void __thiscall mp::pre::ValueNode::ValueNode(ValueNode *this,BasicValuePresolver *pre,string *nm)

{
  string *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x186bd7);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x186bea);
  std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>::vector
            ((vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_> *)0x186bfd);
  in_RDI[10] = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0xb),in_RDX);
  RegisterMe((ValueNode *)0x186c29);
  return;
}

Assistant:

ValueNode(BasicValuePresolver& pre, std::string nm={}) :
    pre_(pre), name_(nm) { RegisterMe(); }